

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef llvm::sys::path::root_path(StringRef path,Style style)

{
  size_t sVar1;
  StringRef SVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  char cVar6;
  Style SVar7;
  StringRef *pSVar8;
  reference pSVar9;
  size_t __n;
  const_iterator *this;
  unsigned_long *puVar10;
  path *ppVar12;
  Style in_R8D;
  StringRef path_00;
  StringRef path_01;
  bool has_drive;
  bool has_net;
  undefined1 local_178 [8];
  const_iterator e;
  const_iterator pos;
  undefined1 local_108 [8];
  const_iterator b;
  path *ppStack_d0;
  Style style_local;
  StringRef path_local;
  unsigned_long local_b8;
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  undefined1 *local_58;
  size_t local_28;
  char *local_20;
  iterator local_18;
  int local_c;
  ulong uVar11;
  
  path_local.Data = (char *)path.Length;
  ppStack_d0 = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = path_local.Data;
  path_00.Length._4_4_ = 0;
  uVar11 = (ulong)style;
  b._44_4_ = style;
  begin((const_iterator *)local_108,ppStack_d0,path_00,in_R8D);
  memcpy(&e.S,local_108,0x30);
  path_01.Length = uVar11;
  path_01.Data = path_local.Data;
  end((const_iterator *)local_178,ppStack_d0,path_01);
  bVar3 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
          ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                        *)local_108,(const_iterator *)local_178);
  if (bVar3) {
    pSVar8 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
             ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                           *)local_108);
    bVar3 = false;
    if (2 < pSVar8->Length) {
      pSVar9 = const_iterator::operator*((const_iterator *)local_108);
      cVar4 = StringRef::operator[](pSVar9,0);
      bVar5 = is_separator(cVar4,b._44_4_);
      bVar3 = false;
      if (bVar5) {
        pSVar9 = const_iterator::operator*((const_iterator *)local_108);
        cVar4 = StringRef::operator[](pSVar9,1);
        pSVar9 = const_iterator::operator*((const_iterator *)local_108);
        cVar6 = StringRef::operator[](pSVar9,0);
        bVar3 = cVar4 == cVar6;
      }
    }
    SVar7 = anon_unknown.dwarf_232906::real_style(b._44_4_);
    bVar5 = false;
    if (SVar7 == windows) {
      pSVar8 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
               ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                             *)local_108);
      __n = strlen(":");
      bVar5 = false;
      if (__n <= pSVar8->Length) {
        local_18 = StringRef::end(pSVar8);
        local_18 = local_18 + -__n;
        local_20 = ":";
        local_28 = __n;
        if (__n == 0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(local_18,":",__n);
        }
        bVar5 = local_c == 0;
      }
    }
    if ((bVar3) || (bVar5)) {
      this = const_iterator::operator++((const_iterator *)&e.S);
      bVar3 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
              ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                            *)this,(const_iterator *)local_178);
      if (bVar3) {
        pSVar9 = const_iterator::operator*((const_iterator *)&e.S);
        cVar4 = StringRef::operator[](pSVar9,0);
        bVar3 = is_separator(cVar4,b._44_4_);
        if (bVar3) {
          pSVar8 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                   ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                                 *)local_108);
          sVar1 = pSVar8->Length;
          pSVar8 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                   ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                                 *)&e.S);
          local_68 = sVar1 + pSVar8->Length;
          local_58 = (undefined1 *)&stack0xffffffffffffff30;
          local_60 = 0;
          puVar10 = std::min<unsigned_long>(&local_60,(unsigned_long *)&path_local);
          local_60 = *puVar10;
          ppVar12 = ppStack_d0 + local_60;
          local_70 = (long)path_local.Data - local_60;
          puVar10 = std::min<unsigned_long>(&local_68,&local_70);
          local_b8 = *puVar10;
          path_local.Length = (size_t)ppVar12;
          goto LAB_0023cfc7;
        }
      }
      pSVar9 = const_iterator::operator*((const_iterator *)local_108);
      local_b8 = pSVar9->Length;
      path_local.Length = (size_t)pSVar9->Data;
      goto LAB_0023cfc7;
    }
    pSVar9 = const_iterator::operator*((const_iterator *)local_108);
    cVar4 = StringRef::operator[](pSVar9,0);
    bVar3 = is_separator(cVar4,b._44_4_);
    if (bVar3) {
      pSVar9 = const_iterator::operator*((const_iterator *)local_108);
      path_local.Length = (size_t)pSVar9->Data;
      local_b8 = pSVar9->Length;
      goto LAB_0023cfc7;
    }
  }
  memset(&path_local.Length,0,0x10);
  StringRef::StringRef((StringRef *)&path_local.Length);
LAB_0023cfc7:
  SVar2.Length = local_b8;
  SVar2.Data = (char *)path_local.Length;
  return SVar2;
}

Assistant:

StringRef root_path(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      if ((++pos != e) && is_separator((*pos)[0], style)) {
        // {C:/,//net/}, so get the first two components.
        return path.substr(0, b->size() + pos->size());
      } else {
        // just {C:,//net}, return the first component.
        return *b;
      }
    }

    // POSIX style root directory.
    if (is_separator((*b)[0], style)) {
      return *b;
    }
  }

  return StringRef();
}